

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<unsigned_int,_Js::DynamicProfileInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this,uint *key)

{
  uint uVar1;
  int iVar2;
  Type piVar3;
  uint uVar4;
  Type pSVar5;
  ulong uVar6;
  ulong uVar7;
  uint depth;
  uint uVar8;
  
  piVar3 = this->buckets;
  depth = 0;
  if (piVar3 != (Type)0x0) {
    uVar4 = GetBucket(*key * 2 + 1,this->bucketCount,this->modFunctionIndex);
    uVar1 = piVar3[uVar4];
    uVar7 = (ulong)(int)uVar1;
    depth = 0;
    if (-1 < (long)uVar7) {
      pSVar5 = this->entries;
      if (pSVar5[uVar7].
          super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
          super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
          .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.key == *key) {
        depth = 0;
        uVar8 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar8 = uVar1;
          depth = depth + 1;
          uVar1 = pSVar5[uVar8].
                  super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
                  super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
                  .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.next;
          uVar7 = (ulong)(int)uVar1;
          if ((long)uVar7 < 0) goto LAB_00b0030f;
        } while (pSVar5[uVar7].
                 super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
                 super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
                 .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.key != *key
                );
      }
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
        pSVar5 = this->entries;
      }
      uVar6 = uVar7 & 0xffffffff;
      iVar2 = pSVar5[uVar6].
              super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
              .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
              super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
              .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.next;
      if ((int)uVar8 < 0) {
        this->buckets[uVar4] = iVar2;
      }
      else {
        pSVar5[uVar8].
        super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
        .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
        super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
        .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.next = iVar2;
      }
      pSVar5[uVar6].
      super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
      super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
      .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.value =
           (DynamicProfileInfo *)0x0;
      pSVar5[uVar6].
      super_DefaultHashedEntry<unsigned_int,_Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<unsigned_int,_Js::DynamicProfileInfo_*>.
      super_ValueEntry<Js::DynamicProfileInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>_>
      .super_KeyValueEntryDataLayout2<unsigned_int,_Js::DynamicProfileInfo_*>.key = 0;
      SetNextFreeEntryIndex
                (this,this->entries + uVar6,-(uint)(this->freeCount == 0) | this->freeList);
      this->freeList = (Type)uVar7;
      this->freeCount = this->freeCount + 1;
      if (this->stats == (DictionaryStats *)0x0) {
        return true;
      }
      DictionaryStats::Remove(this->stats,this->buckets[uVar4] == -1);
      return true;
    }
  }
LAB_00b0030f:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  return false;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }